

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

size_t psql::get_size_struct<0ul,psql::execute_message>
                 (execute_message *input,serialization_context *ctx)

{
  size_t sVar1;
  size_t sVar2;
  __tuple_element_t<0UL,_tuple<string_null_execute_message::*,_int_execute_message::*>_> pmem;
  tuple<psql::string_null_psql::execute_message::*,_int_psql::execute_message::*> fields;
  serialization_context *ctx_local;
  execute_message *input_local;
  
  sVar1 = get_size_struct<1ul,psql::execute_message>(input,ctx);
  sVar2 = get_size<psql::string_null>(&input->portal_name,ctx);
  return sVar1 + sVar2;
}

Assistant:

std::size_t get_size_struct(
	[[maybe_unused]] const T& input,
	[[maybe_unused]] const serialization_context& ctx
) noexcept
{
	constexpr auto fields = get_struct_fields<T>::value;
	if constexpr (index == std::tuple_size<decltype(fields)>::value)
	{
		return 0;
	}
	else
	{
		constexpr auto pmem = std::get<index>(fields);
		return get_size_struct<index+1>(input, ctx) +
		       get_size(input.*pmem, ctx);
	}
}